

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

stbtt__buf stbtt__cff_get_index(stbtt__buf *b)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  stbtt__buf sVar10;
  
  uVar1 = b->cursor;
  iVar2 = b->size;
  uVar4 = 0;
  iVar6 = 2;
  uVar7 = uVar1;
  do {
    if ((int)uVar7 < iVar2) {
      lVar9 = (long)(int)uVar7;
      uVar7 = uVar7 + 1;
      b->cursor = uVar7;
      uVar8 = (uint)b->data[lVar9];
    }
    else {
      uVar8 = 0;
    }
    uVar4 = uVar4 << 8 | uVar8;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  if (uVar4 != 0) {
    iVar6 = b->cursor;
    uVar7 = 0;
    if (iVar6 < iVar2) {
      b->cursor = iVar6 + 1;
      uVar7 = (uint)b->data[iVar6];
    }
    iVar5 = uVar4 * uVar7 + b->cursor;
    iVar6 = iVar5;
    if (iVar2 < iVar5) {
      iVar6 = iVar2;
    }
    if (iVar5 < 0) {
      iVar6 = iVar2;
    }
    b->cursor = iVar6;
    if (uVar7 == 0) {
      iVar6 = -1;
    }
    else {
      uVar4 = 0;
      do {
        if (iVar6 < iVar2) {
          lVar9 = (long)iVar6;
          iVar6 = iVar6 + 1;
          b->cursor = iVar6;
          uVar8 = (uint)b->data[lVar9];
        }
        else {
          uVar8 = 0;
        }
        uVar4 = uVar4 << 8 | uVar8;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      iVar6 = uVar4 - 1;
    }
    iVar6 = iVar6 + b->cursor;
    iVar5 = iVar6;
    if (iVar2 < iVar6) {
      iVar5 = iVar2;
    }
    if (iVar6 < 0) {
      iVar5 = iVar2;
    }
    b->cursor = iVar5;
  }
  uVar7 = b->cursor - uVar1;
  if (-1 < (int)(uVar7 | uVar1)) {
    puVar3 = (uchar *)0x0;
    lVar9 = 0;
    if (b->cursor <= iVar2 && (int)uVar1 <= iVar2) {
      puVar3 = b->data + uVar1;
      lVar9 = (ulong)uVar7 << 0x20;
    }
    sVar10.cursor = (int)lVar9;
    sVar10.size = (int)((ulong)lVar9 >> 0x20);
    sVar10.data = puVar3;
    return sVar10;
  }
  return (stbtt__buf)ZEXT816(0);
}

Assistant:

static stbtt__buf stbtt__cff_get_index(stbtt__buf *b)
{
   int count, start, offsize;
   start = b->cursor;
   count = stbtt__buf_get16(b);
   if (count) {
      offsize = stbtt__buf_get8(b);
      STBTT_assert(offsize >= 1 && offsize <= 4);
      stbtt__buf_skip(b, offsize * count);
      stbtt__buf_skip(b, stbtt__buf_get(b, offsize) - 1);
   }
   return stbtt__buf_range(b, start, b->cursor - start);
}